

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

char __thiscall Buffer::consume(Buffer *this,char c)

{
  uint uVar1;
  char cVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  char *condition;
  char *pcVar4;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  uVar3 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  local_40 = (undefined1  [8])&this->mutex;
  lock._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  lock._M_device._0_1_ = 1;
  pcVar4 = "First element is other";
  if (this->position < 4) {
    pcVar4 = "Less than 3 elements";
  }
  cVar2 = (char)uVar3;
  if ((this->position < 4) || (this->buffer[0] != cVar2)) {
    printf("Consumer %c waits (%s)\n",uVar3,pcVar4);
    if ((this->position < 4) || (this->buffer[0] != cVar2)) {
      do {
        do {
          std::condition_variable::wait((unique_lock *)&this->cond);
        } while (this->position < 4);
      } while (this->buffer[0] != cVar2);
    }
    printf("Consumer %c consumes after waiting (%s)\n",uVar3,pcVar4);
  }
  else {
    printf("Consumer %c consumes\n",uVar3);
  }
  uVar1 = this->position - 1;
  if (1 < this->position) {
    memmove(this->buffer,this->buffer + 1,(ulong)uVar1);
  }
  this->position = uVar1;
  printBuffer(this);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return cVar2;
}

Assistant:

char Buffer::consume(char c) {
    std::unique_lock<std::mutex> lock(mutex);

    const bool lessThan3Elements = !isMoreThan3Elements();
    const bool isFirstElementOther = !isFirstElement(c);
    if (lessThan3Elements || isFirstElementOther) {
        const char *const condition = lessThan3Elements ? LESS_THAN_3_ELEMENTS : FIRST_ELEMENT_OTHER;
        printf("Consumer %c waits (%s)\n", c, condition);

        cond.wait(lock, [this, c]() -> bool { return isMoreThan3Elements() && isFirstElement(c); });

        printf("Consumer %c consumes after waiting (%s)\n", c, condition);
    } else {
        printf("Consumer %c consumes\n", c);
    }

    for (int i = 0; i < position - 1; ++i) {
        buffer[i] = buffer[i + 1];
    }
    --position;
    printBuffer();

    lock.unlock();
    cond.notify_all();
    return c;
}